

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O0

void copylist(List *l,Item *i)

{
  short *in_RDI;
  Item *q;
  Symbol *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  short *local_18;
  
  local_18 = *(short **)(in_RDI + 8);
  do {
    if (local_18 == in_RDI) {
      return;
    }
    if (*local_18 == 1) {
      insertsym((Item *)CONCAT44(1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
    else {
      if (*local_18 != 0x143) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/deriv.c"
                      ,0x3e0,"void copylist()");
      }
      insertstr((Item *)CONCAT44(0x143,in_stack_ffffffffffffffe0),(char *)in_stack_ffffffffffffffd8)
      ;
    }
    local_18 = *(short **)(local_18 + 8);
  } while( true );
}

Assistant:

static void copylist(l, i)	/* copy list l before item i */
	List *l;
	Item *i;
{
	Item *q;
	
	ITERATE(q, l) {
		switch(q->itemtype) {

		case STRING:
			Insertstr(i, STR(q));
			break;
		case SYMBOL:
			Insertsym(i, SYM(q));
			break;
		default:
			/*SUPPRESS 622*/
			assert(0);
		}
	}
}